

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllypticPoint.cpp
# Opt level: O2

EllypticPoint * __thiscall
EllypticPoint::operator+
          (EllypticPoint *__return_storage_ptr__,EllypticPoint *this,EllypticPoint *other)

{
  bool bVar1;
  BigInteger *pBVar2;
  BigInteger BStack_2d8;
  BigInteger local_2b8;
  BigInteger local_298;
  BigInteger local_278;
  BigInteger local_258;
  BigInteger local_238;
  BigInteger x1;
  BigInteger lambda;
  BigInteger y1;
  Algorithms local_1b8;
  BigInteger local_198;
  BigInteger x3;
  BigInteger x2;
  BigInteger y3;
  BigInteger y2;
  BigInteger local_f8;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  BigInteger local_78;
  BigInteger local_58;
  BigInteger local_38;
  
  BigIntegerLibrary::BigInteger::BigInteger(&x1,&this->x);
  BigIntegerLibrary::BigInteger::BigInteger(&y1,&this->y);
  BigIntegerLibrary::BigInteger::BigInteger(&x2,&other->x);
  BigIntegerLibrary::BigInteger::BigInteger(&y2,&other->y);
  BigIntegerLibrary::BigInteger::BigInteger(&x3,0);
  BigIntegerLibrary::BigInteger::BigInteger(&y3,0);
  local_1b8.listOfPrimeDivisors.
  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.listOfPrimeDivisors.
  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.listOfPrimeDivisors.
  super__Vector_base<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = BigIntegerLibrary::BigInteger::operator!=(&x1,&x2);
  if (bVar1) {
    bVar1 = BigIntegerLibrary::BigInteger::operator!=(&y1,&y2);
    if (!bVar1) goto LAB_0010a20e;
    BigIntegerLibrary::BigInteger::operator-(&local_298,&y2,&y1);
    pBVar2 = &this->p;
    BigIntegerLibrary::BigInteger::operator+(&local_278,&local_298,pBVar2);
    BigIntegerLibrary::BigInteger::operator%(&local_258,&local_278,pBVar2);
    BigIntegerLibrary::BigInteger::operator-(&local_198,&x2,&x1);
    BigIntegerLibrary::BigInteger::operator+(&BStack_2d8,&local_198,pBVar2);
    BigIntegerLibrary::BigInteger::operator%(&local_38,&BStack_2d8,pBVar2);
    BigIntegerLibrary::BigInteger::BigInteger(&local_58,pBVar2);
    Algorithms::inverse(&local_2b8,&local_1b8,&local_38,&local_58);
    BigIntegerLibrary::BigInteger::operator*(&local_238,&local_258,&local_2b8);
    BigIntegerLibrary::BigInteger::operator%(&lambda,&local_238,pBVar2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_38);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&BStack_2d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_198);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_258);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_278);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_298);
    BigIntegerLibrary::BigInteger::operator*(&local_2b8,&lambda,&lambda);
    BigIntegerLibrary::BigInteger::operator-(&local_298,&local_2b8,&x2);
    BigIntegerLibrary::BigInteger::operator-(&local_278,&local_298,&x1);
    BigIntegerLibrary::BigInteger::operator*(&BStack_2d8,pBVar2,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_258,&local_278,&BStack_2d8);
    BigIntegerLibrary::BigInteger::operator%(&local_238,&local_258,pBVar2);
    BigIntegerLibrary::BigInteger::operator=(&x3,&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_258);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&BStack_2d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_278);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_298);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
    BigIntegerLibrary::BigInteger::operator-(&local_2b8,&x1,&x3);
    BigIntegerLibrary::BigInteger::operator*(&local_298,&lambda,&local_2b8);
    BigIntegerLibrary::BigInteger::operator-(&local_278,&local_298,&y1);
    BigIntegerLibrary::BigInteger::operator*(&BStack_2d8,pBVar2,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_258,&local_278,&BStack_2d8);
    BigIntegerLibrary::BigInteger::operator%(&local_238,&local_258,pBVar2);
    BigIntegerLibrary::BigInteger::operator=(&y3,&local_238);
  }
  else {
LAB_0010a20e:
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&x1,&x2);
    if (!bVar1) goto LAB_0010a56f;
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&y1,&y2);
    if (!bVar1) goto LAB_0010a56f;
    BigIntegerLibrary::BigInteger::operator*(&BStack_2d8,&x1,&x1);
    BigIntegerLibrary::BigInteger::operator*(&local_2b8,&BStack_2d8,3);
    BigIntegerLibrary::BigInteger::operator+(&local_298,&local_2b8,&this->a);
    pBVar2 = &this->p;
    BigIntegerLibrary::BigInteger::operator*(&local_198,pBVar2,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_278,&local_298,&local_198);
    BigIntegerLibrary::BigInteger::operator%(&local_258,&local_278,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_98,&y1,&y1);
    BigIntegerLibrary::BigInteger::BigInteger(&local_b8,pBVar2);
    Algorithms::inverse(&local_78,&local_1b8,&local_98,&local_b8);
    BigIntegerLibrary::BigInteger::operator*(&local_238,&local_258,&local_78);
    BigIntegerLibrary::BigInteger::operator%(&lambda,&local_238,pBVar2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_258);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_278);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_198);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_298);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&BStack_2d8);
    BigIntegerLibrary::BigInteger::operator*(&local_2b8,&lambda,&lambda);
    BigIntegerLibrary::BigInteger::operator-(&local_298,&local_2b8,&x2);
    BigIntegerLibrary::BigInteger::operator-(&local_278,&local_298,&x1);
    BigIntegerLibrary::BigInteger::operator*(&BStack_2d8,pBVar2,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_258,&local_278,&BStack_2d8);
    BigIntegerLibrary::BigInteger::operator%(&local_238,&local_258,pBVar2);
    BigIntegerLibrary::BigInteger::operator=(&x3,&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_238);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_258);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&BStack_2d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_278);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_298);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
    BigIntegerLibrary::BigInteger::operator-(&local_2b8,&x1,&x3);
    BigIntegerLibrary::BigInteger::operator*(&local_298,&lambda,&local_2b8);
    BigIntegerLibrary::BigInteger::operator-(&local_278,&local_298,&y1);
    BigIntegerLibrary::BigInteger::operator*(&BStack_2d8,pBVar2,pBVar2);
    BigIntegerLibrary::BigInteger::operator+(&local_258,&local_278,&BStack_2d8);
    BigIntegerLibrary::BigInteger::operator%(&local_238,&local_258,pBVar2);
    BigIntegerLibrary::BigInteger::operator=(&y3,&local_238);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_238);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_258);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&BStack_2d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_278);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_298);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_2b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lambda);
LAB_0010a56f:
  BigIntegerLibrary::BigInteger::BigInteger(&local_d8,&x3);
  BigIntegerLibrary::BigInteger::BigInteger(&local_f8,&y3);
  EllypticPoint(__return_storage_ptr__,&local_d8,&local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
  std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
  ~vector(&local_1b8.listOfPrimeDivisors);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&y3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&x3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&y2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&x2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&y1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&x1);
  return __return_storage_ptr__;
}

Assistant:

EllypticPoint EllypticPoint::operator+(const EllypticPoint& other) const {
    BigInteger x1 = x, y1 = y;
    BigInteger x2 = other.x, y2 = other.y;
    BigInteger x3(0), y3(0);
    Algorithms algorithms = Algorithms();
    if (x1 != x2 && y1 != y2) {
        BigInteger lambda = ((y2 - y1 + p) % p * algorithms.inverse((x2 - x1 + p) % p, p)) % p;
//        lambda = a;
        x3 = (lambda * lambda - x2 - x1 + p * p) % p;
        y3 = (lambda * (x1 - x3) - y1 + p * p) % p;
    } else if (x1 == x2 && y1 == y2) {
        BigInteger lambda = (x1 * x1 * 3 + a + p * p) % p * algorithms.inverse (y1 + y1, p) % p;
//        lambda = a;
        x3 = (lambda * lambda - x2 - x1 + p * p) % p;
        y3 = (lambda * (x1 - x3) - y1 + p * p) % p;
    } else {
//        cout << "Mda";
    }
    return EllypticPoint(x3, y3);
}